

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbo.cpp
# Opt level: O0

void __thiscall vera::Fbo::~Fbo(Fbo *this)

{
  Fbo *this_local;
  
  this->_vptr_Fbo = (_func_int **)&PTR__Fbo_0076c0e0;
  (*this->_vptr_Fbo[4])();
  if ((this->m_allocated & 1U) != 0) {
    glDeleteTextures(1,&this->m_id);
    glDeleteRenderbuffers(1,&this->m_depth_buffer);
    glDeleteFramebuffers(1,&this->m_fbo_id);
    this->m_allocated = false;
  }
  return;
}

Assistant:

Fbo::~Fbo() {
    unbind();
    if (m_allocated) {
        glDeleteTextures(1, &m_id);
        glDeleteRenderbuffers(1, &m_depth_buffer);
        glDeleteFramebuffers(1, &m_fbo_id);
        m_allocated = false;
    }
}